

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O1

int mk_buffer_cat(mk_ptr_t *p,char *buf1,int len1,char *buf2,int len2)

{
  unsigned_long uVar1;
  int iVar2;
  char *__dest;
  long lVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  char *__size;
  int iVar7;
  ulong __n;
  
  if ((len2 | len1) < 0) {
    iVar2 = -1;
  }
  else {
    __n = (ulong)(uint)len1;
    uVar1 = (uint)len2 + __n;
    __size = (char *)(ulong)((int)uVar1 + 1);
    pcVar6 = buf1;
    __dest = (char *)malloc((size_t)__size);
    iVar2 = (int)pcVar6;
    if (__dest == (char *)0x0) {
      mk_buffer_cat_cold_1();
      cVar5 = *__size;
      iVar4 = 0;
      if (0 < iVar2 && cVar5 != '\0') {
        iVar4 = 0;
        lVar3 = 1;
        do {
          iVar7 = (int)cVar5;
          iVar4 = iVar4 * 0x10;
          if ((byte)(cVar5 + 0x9fU) < 6) {
            iVar4 = iVar4 + iVar7 + -0x57;
          }
          else if ((byte)(cVar5 + 0xbfU) < 6) {
            iVar4 = iVar4 + iVar7 + -0x37;
          }
          else {
            if (9 < (byte)(cVar5 - 0x30U)) {
              return -1;
            }
            iVar4 = iVar4 + iVar7 + -0x30;
          }
          cVar5 = __size[lVar3];
        } while ((cVar5 != '\0') && (iVar7 = (int)lVar3, lVar3 = lVar3 + 1, iVar7 < iVar2));
      }
      iVar2 = -1;
      if (-1 < iVar4) {
        iVar2 = iVar4;
      }
      return iVar2;
    }
    p->data = __dest;
    memcpy(__dest,buf1,__n);
    memcpy(__dest + __n,buf2,(ulong)(uint)len2);
    __dest[uVar1] = '\0';
    p->len = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mk_buffer_cat(mk_ptr_t *p, char *buf1, int len1, char *buf2, int len2)
{
    /* Validate lengths */
    if (mk_unlikely(len1 < 0 || len2 < 0)) {
         return -1;
    }

    /* alloc space */
    p->data = (char *) mk_mem_alloc(len1 + len2 + 1);

    /* copy data */
    memcpy(p->data, buf1, len1);
    memcpy(p->data + len1, buf2, len2);
    p->data[len1 + len2] = '\0';

    /* assign len */
    p->len = len1 + len2;

    return 0;
}